

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O1

void SCurveSpdCtrl_New(SCurveSpdCtrl_t *pSCurveSpdCtrl,float time_inc,float acc,float dec,
                      float target_spd)

{
  pSCurveSpdCtrl->Flag = '\0';
  pSCurveSpdCtrl->TimeInc = time_inc;
  pSCurveSpdCtrl->Acc = acc;
  pSCurveSpdCtrl->Dec = dec;
  pSCurveSpdCtrl->TargetSpd = target_spd;
  pSCurveSpdCtrl->Spd = 0.0;
  pSCurveSpdCtrl->SpdOutput = 0.0;
  return;
}

Assistant:

void SCurveSpdCtrl_New(SCurveSpdCtrl_t *pSCurveSpdCtrl, float time_inc, float acc, float dec, float target_spd)
{
	pSCurveSpdCtrl->Flag = 0;
	pSCurveSpdCtrl->TimeInc = time_inc;
	pSCurveSpdCtrl->Acc = acc;
	pSCurveSpdCtrl->Dec = dec;
	pSCurveSpdCtrl->TargetSpd = target_spd;

	pSCurveSpdCtrl->Spd = 0.0f;

	pSCurveSpdCtrl->SpdOutput = 0.0f;
}